

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall
cmCTest::Base64GzipEncodeFile(string *__return_storage_ptr__,cmCTest *this,string *file)

{
  bool bVar1;
  ostream *poVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_00;
  string local_238;
  string tarFile;
  string parentDir;
  string currDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ostringstream cmCTestLog_msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [22];
  
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmsys::SystemTools::GetParentDirectory(&parentDir,file);
  bVar1 = std::operator!=(&currDir,&parentDir);
  if (bVar1) {
    bVar1 = TryToChangeDirectory(this,&parentDir);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&cmCTestLog_msg);
      goto LAB_00173ef6;
    }
  }
  std::operator+(&tarFile,file,"_temp.tar.gz");
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&files,file);
  _cmCTestLog_msg = (pointer)local_188;
  local_188[0]._M_local_buf[0] = '\0';
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238._M_string_length = 0;
  local_238.field_2._M_local_buf[0] = '\0';
  files_00 = &files;
  bVar1 = cmSystemTools::CreateTar
                    (&tarFile,files_00,TarCompressGZip,false,(string *)&cmCTestLog_msg,&local_238,0)
  ;
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (bVar1) {
    Base64EncodeFile(__return_storage_ptr__,(cmCTest *)files_00,&tarFile);
    cmsys::SystemTools::RemoveFile(&tarFile);
    bVar1 = std::operator!=(&currDir,&parentDir);
    if (bVar1) {
      cmsys::SystemTools::ChangeDirectory(&currDir);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Error creating tar while encoding file: ");
    poVar2 = std::operator<<(poVar2,(string *)file);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x674,local_238._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&cmCTestLog_msg);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  std::__cxx11::string::~string((string *)&tarFile);
LAB_00173ef6:
  std::__cxx11::string::~string((string *)&parentDir);
  std::__cxx11::string::~string((string *)&currDir);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::Base64GzipEncodeFile(std::string const& file)
{
  const std::string currDir = cmSystemTools::GetCurrentWorkingDirectory();
  std::string parentDir = cmSystemTools::GetParentDirectory(file);

  // Temporarily change to the file's directory so the tar gets created
  // with a flat directory structure.
  if (currDir != parentDir) {
    if (!this->TryToChangeDirectory(parentDir)) {
      return "";
    }
  }

  std::string tarFile = file + "_temp.tar.gz";
  std::vector<std::string> files;
  files.push_back(file);

  if (!cmSystemTools::CreateTar(tarFile, files, cmSystemTools::TarCompressGZip,
                                false)) {
    cmCTestLog(this, ERROR_MESSAGE,
               "Error creating tar while "
               "encoding file: "
                 << file << std::endl);
    return "";
  }
  std::string base64 = this->Base64EncodeFile(tarFile);
  cmSystemTools::RemoveFile(tarFile);

  // Change back to the directory we started in.
  if (currDir != parentDir) {
    cmSystemTools::ChangeDirectory(currDir);
  }

  return base64;
}